

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void ecs_map_remove(ecs_map_t *map,ecs_map_key_t key)

{
  int iVar1;
  ecs_bucket_t *bucket;
  long lVar2;
  
  _ecs_assert(map != (ecs_map_t *)0x0,2,(char *)0x0,"map != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x162);
  if (map != (ecs_map_t *)0x0) {
    bucket = get_bucket(map,key);
    if ((bucket != (ecs_bucket_t *)0x0) && (iVar1 = bucket->count, 0 < (long)iVar1)) {
      lVar2 = 0;
      do {
        if (bucket->keys[lVar2] == key) {
          remove_from_bucket(bucket,map->elem_size,key,(int32_t)lVar2);
          map->count = map->count + -1;
        }
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
    return;
  }
  __assert_fail("map != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0x162,"void ecs_map_remove(ecs_map_t *, ecs_map_key_t)");
}

Assistant:

void ecs_map_remove(
    ecs_map_t *map,
    ecs_map_key_t key)
{
    ecs_assert(map != NULL, ECS_INVALID_PARAMETER, NULL);

    ecs_bucket_t * bucket = get_bucket(map, key);
    if (!bucket) {
        return;
    }

    int32_t i, bucket_count = bucket->count;
    for (i = 0; i < bucket_count; i ++) {
        if (bucket->keys[i] == key) {
            remove_from_bucket(bucket, map->elem_size, key, i);
            map->count --;
        }
    } 
}